

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ARMDisassembler.c
# Opt level: O1

DecodeStatus DecodeAddrMode3Instruction(MCInst *Inst,uint Insn,uint64_t Address,void *Decoder)

{
  uint uVar1;
  uint uVar2;
  DecodeStatus DVar3;
  void *Decoder_00;
  uint64_t Address_00;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  
  uVar4 = Insn >> 0xc & 0xf;
  MCInst_getOpcode(Inst);
  uVar5 = Insn >> 0x10 & 0xf;
  uVar6 = ~Insn >> 0xf & 0x100;
  uVar1 = Insn & 0x1200000;
  uVar2 = MCInst_getOpcode(Inst);
  uVar2 = uVar2 - 0xa4;
  if (((((0x18 < uVar2) || ((0x19c8000U >> (uVar2 & 0x1f) & 1) != 0)) ||
       ((7U >> (uVar2 & 0x1f) & 1) == 0)) ||
      ((uVar5 == 0xf && (Insn >> 0x16 & 1) != 0 || (uVar1 != 0x1000000)))) && (uVar1 != 0x1000000))
  {
    Inst->writeback = true;
    uVar6 = uVar6 + (uint)((Insn >> 0x18 & 1) == 0) * 0x200 + 0x200;
    uVar2 = MCInst_getOpcode(Inst);
    if ((uVar2 - 0x1af < 0xc) && ((0xc87U >> (uVar2 - 0x1af & 0x1f) & 1) != 0)) {
      MCOperand_CreateReg0(Inst,(uint)GPRDecoderTable[uVar5]);
    }
  }
  MCOperand_CreateReg0(Inst,(uint)GPRDecoderTable[uVar4]);
  uVar2 = MCInst_getOpcode(Inst);
  Decoder_00 = (void *)(ulong)(uVar2 - 0x1af);
  if ((2 < uVar2 - 0x1af) && (2 < uVar2 - 0xa4)) {
    if (uVar1 != 0x1000000) {
      uVar2 = MCInst_getOpcode(Inst);
      if ((uVar2 - 0xa4 < 0x19) &&
         (Decoder_00 = (void *)0x19e8e87, (0x19e8e87U >> (uVar2 - 0xa4 & 0x1f) & 1) != 0)) {
        MCOperand_CreateReg0(Inst,(uint)GPRDecoderTable[uVar5]);
      }
    }
    MCOperand_CreateReg0(Inst,(uint)GPRDecoderTable[uVar5]);
    if ((Insn >> 0x16 & 1) == 0) {
      MCOperand_CreateReg0(Inst,(uint)GPRDecoderTable[Insn & 0xf]);
    }
    else {
      MCOperand_CreateReg0(Inst,0);
      uVar6 = (Insn >> 8 & 0xf) * 0x10 + (Insn & 0xf) | uVar6;
    }
    MCOperand_CreateImm0(Inst,(ulong)uVar6);
    DVar3 = DecodePredicateOperand(Inst,Insn >> 0x1c,Address_00,Decoder_00);
    DVar3 = (*(code *)(&DAT_0036297c + *(int *)(&DAT_0036297c + (ulong)DVar3 * 4)))();
    return DVar3;
  }
  uVar2 = 0;
  if (uVar4 != 0xf) {
    MCOperand_CreateReg0(Inst,(uint)GPRDecoderTable[uVar4 + 1]);
    uVar2 = 3;
  }
  DVar3 = (*(code *)((long)&DAT_0036296c + (long)(int)(&DAT_0036296c)[uVar2]))();
  return DVar3;
}

Assistant:

static DecodeStatus DecodeAddrMode3Instruction(MCInst *Inst, unsigned Insn,
		uint64_t Address, const void *Decoder)
{
	DecodeStatus S = MCDisassembler_Success;

	unsigned Rt = fieldFromInstruction_4(Insn, 12, 4);
	unsigned Rn = fieldFromInstruction_4(Insn, 16, 4);
	unsigned Rm = fieldFromInstruction_4(Insn, 0, 4);
	unsigned type = fieldFromInstruction_4(Insn, 22, 1);
	unsigned imm = fieldFromInstruction_4(Insn, 8, 4);
	unsigned U = ((~fieldFromInstruction_4(Insn, 23, 1)) & 1) << 8;
	unsigned pred = fieldFromInstruction_4(Insn, 28, 4);
	unsigned W = fieldFromInstruction_4(Insn, 21, 1);
	unsigned P = fieldFromInstruction_4(Insn, 24, 1);
	unsigned Rt2 = Rt + 1;

	bool writeback = (W == 1) | (P == 0);

	// For {LD,ST}RD, Rt must be even, else undefined.
	switch (MCInst_getOpcode(Inst)) {
		case ARM_STRD:
		case ARM_STRD_PRE:
		case ARM_STRD_POST:
		case ARM_LDRD:
		case ARM_LDRD_PRE:
		case ARM_LDRD_POST:
			if (Rt & 0x1) S = MCDisassembler_SoftFail;
			break;
		default:
			break;
	}
	switch (MCInst_getOpcode(Inst)) {
		case ARM_STRD:
		case ARM_STRD_PRE:
		case ARM_STRD_POST:
			if (P == 0 && W == 1)
				S = MCDisassembler_SoftFail;

			if (writeback && (Rn == 15 || Rn == Rt || Rn == Rt2))
				S = MCDisassembler_SoftFail;
			if (type && Rm == 15)
				S = MCDisassembler_SoftFail;
			if (Rt2 == 15)
				S = MCDisassembler_SoftFail;
			if (!type && fieldFromInstruction_4(Insn, 8, 4))
				S = MCDisassembler_SoftFail;
			break;
		case ARM_STRH:
		case ARM_STRH_PRE:
		case ARM_STRH_POST:
			if (Rt == 15)
				S = MCDisassembler_SoftFail;
			if (writeback && (Rn == 15 || Rn == Rt))
				S = MCDisassembler_SoftFail;
			if (!type && Rm == 15)
				S = MCDisassembler_SoftFail;
			break;
		case ARM_LDRD:
		case ARM_LDRD_PRE:
		case ARM_LDRD_POST:
			if (type && Rn == 15){
				if (Rt2 == 15)
					S = MCDisassembler_SoftFail;
				break;
			}
			if (P == 0 && W == 1)
				S = MCDisassembler_SoftFail;
			if (!type && (Rt2 == 15 || Rm == 15 || Rm == Rt || Rm == Rt2))
				S = MCDisassembler_SoftFail;
			if (!type && writeback && Rn == 15)
				S = MCDisassembler_SoftFail;
			if (writeback && (Rn == Rt || Rn == Rt2))
				S = MCDisassembler_SoftFail;
			break;
		case ARM_LDRH:
		case ARM_LDRH_PRE:
		case ARM_LDRH_POST:
			if (type && Rn == 15){
				if (Rt == 15)
					S = MCDisassembler_SoftFail;
				break;
			}
			if (Rt == 15)
				S = MCDisassembler_SoftFail;
			if (!type && Rm == 15)
				S = MCDisassembler_SoftFail;
			if (!type && writeback && (Rn == 15 || Rn == Rt))
				S = MCDisassembler_SoftFail;
			break;
		case ARM_LDRSH:
		case ARM_LDRSH_PRE:
		case ARM_LDRSH_POST:
		case ARM_LDRSB:
		case ARM_LDRSB_PRE:
		case ARM_LDRSB_POST:
			if (type && Rn == 15){
				if (Rt == 15)
					S = MCDisassembler_SoftFail;
				break;
			}
			if (type && (Rt == 15 || (writeback && Rn == Rt)))
				S = MCDisassembler_SoftFail;
			if (!type && (Rt == 15 || Rm == 15))
				S = MCDisassembler_SoftFail;
			if (!type && writeback && (Rn == 15 || Rn == Rt))
				S = MCDisassembler_SoftFail;
			break;
		default:
			break;
	}

	if (writeback) { // Writeback
		Inst->writeback = true;
		if (P)
			U |= ARMII_IndexModePre << 9;
		else
			U |= ARMII_IndexModePost << 9;

		// On stores, the writeback operand precedes Rt.
		switch (MCInst_getOpcode(Inst)) {
			case ARM_STRD:
			case ARM_STRD_PRE:
			case ARM_STRD_POST:
			case ARM_STRH:
			case ARM_STRH_PRE:
			case ARM_STRH_POST:
				if (!Check(&S, DecodeGPRRegisterClass(Inst, Rn, Address, Decoder)))
					return MCDisassembler_Fail;
				break;
			default:
				break;
		}
	}

	if (!Check(&S, DecodeGPRRegisterClass(Inst, Rt, Address, Decoder)))
		return MCDisassembler_Fail;
	switch (MCInst_getOpcode(Inst)) {
		case ARM_STRD:
		case ARM_STRD_PRE:
		case ARM_STRD_POST:
		case ARM_LDRD:
		case ARM_LDRD_PRE:
		case ARM_LDRD_POST:
			if (!Check(&S, DecodeGPRRegisterClass(Inst, Rt+1, Address, Decoder)))
				return MCDisassembler_Fail;
			break;
		default:
			break;
	}

	if (writeback) {
		// On loads, the writeback operand comes after Rt.
		switch (MCInst_getOpcode(Inst)) {
			case ARM_LDRD:
			case ARM_LDRD_PRE:
			case ARM_LDRD_POST:
			case ARM_LDRH:
			case ARM_LDRH_PRE:
			case ARM_LDRH_POST:
			case ARM_LDRSH:
			case ARM_LDRSH_PRE:
			case ARM_LDRSH_POST:
			case ARM_LDRSB:
			case ARM_LDRSB_PRE:
			case ARM_LDRSB_POST:
			case ARM_LDRHTr:
			case ARM_LDRSBTr:
				if (!Check(&S, DecodeGPRRegisterClass(Inst, Rn, Address, Decoder)))
					return MCDisassembler_Fail;
				break;
			default:
				break;
		}
	}

	if (!Check(&S, DecodeGPRRegisterClass(Inst, Rn, Address, Decoder)))
		return MCDisassembler_Fail;

	if (type) {
		MCOperand_CreateReg0(Inst, 0);
		MCOperand_CreateImm0(Inst, U | (imm << 4) | Rm);
	} else {
		if (!Check(&S, DecodeGPRRegisterClass(Inst, Rm, Address, Decoder)))
			return MCDisassembler_Fail;
		MCOperand_CreateImm0(Inst, U);
	}

	if (!Check(&S, DecodePredicateOperand(Inst, pred, Address, Decoder)))
		return MCDisassembler_Fail;

	return S;
}